

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardDemodulation.cpp
# Opt level: O3

bool __thiscall
Inferences::ForwardDemodulationImpl<true>::perform
          (ForwardDemodulationImpl<true> *this,Clause *cl,Clause **replacement,
          ClauseIterator *premises)

{
  int *piVar1;
  Literal ***pppLVar2;
  long *plVar3;
  Term *term;
  DemodulationLHSIndex *pDVar4;
  TermIndexingStructure<Indexing::DemodulatorData> *pTVar5;
  _func_int **pp_Var6;
  Term *pTVar7;
  Self SVar8;
  bool bVar9;
  char cVar10;
  bool bVar11;
  uint uVar12;
  Result RVar13;
  int iVar14;
  void **head_1;
  TermList rwTerm;
  TermList TVar15;
  void *pvVar16;
  Literal *pLVar17;
  Literal **ppLVar18;
  Clause *pCVar19;
  InferenceExtra *extra;
  ulong uVar20;
  uint uVar21;
  EVP_PKEY_CTX *ctx;
  ulong uVar22;
  uint uVar23;
  void **head;
  uint i;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData> qr;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
  git;
  RStack<Literal_*> resLits;
  Applicator applWithoutEqSort;
  SmartPtr<Indexing::ResultSubstitution> subs;
  ApplicatorWithEqSort applWithEqSort;
  bool local_1a4;
  long *local_1a0;
  int *local_198;
  ulong *local_190;
  long *local_188;
  TermList local_180;
  SimplifyingInference2 local_178;
  Ordering *local_160;
  ClauseIterator *local_158;
  DemodulationHelper *local_150;
  long *local_148;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_140;
  _func_int **local_130;
  ulong local_128;
  _func_int **local_120;
  Clause **local_118;
  TermList local_110;
  int *local_108;
  uint64_t local_100;
  undefined1 uStack_f8;
  EVP_PKEY_CTX *local_f0;
  uint64_t local_e8;
  uint uStack_e0;
  undefined8 local_d8;
  FirstOrderSubtermIt local_d0;
  undefined **local_98;
  long *local_90;
  long *local_88;
  int *local_80;
  undefined **local_78;
  long *local_70;
  RobSubstitution *local_68;
  Inference local_60;
  
  local_160 = (((this->super_ForwardDemodulation).super_ForwardSimplificationEngine.
                super_InferenceEngine._salg)->_ordering)._obj;
  local_158 = premises;
  local_118 = replacement;
  if (perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::attempted ==
      '\0') {
    perform();
  }
  Lib::DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (&perform::attempted._map);
  if ((*(ulong *)&cl->field_0x38 & 0xfffff) != 0) {
    local_150 = &(this->super_ForwardDemodulation)._helper;
    uVar22 = (ulong)((uint)*(ulong *)&cl->field_0x38 & 0xfffff);
    uVar20 = 0;
    local_130 = (_func_int **)&PTR__FirstOrderSubtermIt_00b3d9d8;
    local_120 = (_func_int **)&PTR__InferenceExtra_00b3a620;
    do {
      term = &cl->_literals[uVar20]->super_Term;
      bVar9 = Kernel::Literal::isAnswerLiteral((Literal *)term);
      if ((!bVar9) &&
         (((this->super_ForwardDemodulation)._skipNonequationalLiterals != true ||
          (term->_functor == 0)))) {
        local_128 = uVar20;
        Kernel::FirstOrderSubtermIt::FirstOrderSubtermIt(&local_d0,term,false);
        do {
          while( true ) {
            if (local_d0._stack._cursor == local_d0._stack._stack) {
              uVar21 = 0;
              goto LAB_004c8f8d;
            }
            rwTerm._content = (uint64_t)Kernel::FirstOrderSubtermIt::next(&local_d0);
            local_110 = Kernel::SortHelper::getResultSort((Term *)rwTerm._content);
            bVar9 = Lib::
                    DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
                    insert(&perform::attempted._map,rwTerm._content);
            if (bVar9) break;
            Kernel::FirstOrderSubtermIt::right(&local_d0);
          }
          bVar9 = DemodulationHelper::redundancyCheckNeededForPremise
                            (local_150,cl,(Literal *)term,rwTerm);
          pDVar4 = (this->super_ForwardDemodulation)._index;
          TVar15 = Kernel::SortHelper::getResultSort((Term *)rwTerm._content);
          pTVar5 = (pDVar4->super_TermIndex<Indexing::DemodulatorData>)._is._M_t.
                   super___uniq_ptr_impl<Indexing::TermIndexingStructure<Indexing::DemodulatorData>,_std::default_delete<Indexing::TermIndexingStructure<Indexing::DemodulatorData>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Indexing::TermIndexingStructure<Indexing::DemodulatorData>_*,_std::default_delete<Indexing::TermIndexingStructure<Indexing::DemodulatorData>_>_>
                   .
                   super__Head_base<0UL,_Indexing::TermIndexingStructure<Indexing::DemodulatorData>_*,_false>
                   ._M_head_impl;
          (*pTVar5->_vptr_TermIndexingStructure[6])
                    (&local_188,pTVar5,rwTerm._content,TVar15._content,1);
          do {
            cVar10 = (**(code **)(*local_188 + 0x10))();
            if (cVar10 == '\0') {
              uVar21 = 0;
              break;
            }
            (**(code **)(*local_188 + 0x18))(&local_1a0);
            uVar23 = (uint)*(undefined8 *)&cl->field_0x38;
            if ((~uVar23 & 0x300000) == 0) {
              Kernel::Clause::computeColor(cl);
              uVar23 = (uint)*(undefined8 *)&cl->field_0x38;
            }
            pCVar19 = (Clause *)local_190[3];
            uVar12 = (uint)*(undefined8 *)&pCVar19->field_0x38;
            if ((~uVar12 & 0x300000) == 0) {
              Kernel::Clause::computeColor(pCVar19);
              uVar12 = (uint)*(undefined8 *)&pCVar19->field_0x38;
            }
            uVar21 = 7;
            if ((~(uVar12 | uVar23) & 0x300000) != 0) {
              pp_Var6 = (_func_int **)*local_190;
              if ((perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                   ::eqSortSubs == '\0') &&
                 (iVar14 = __cxa_guard_acquire(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                                ::eqSortSubs), iVar14 != 0)) {
                Kernel::RobSubstitution::RobSubstitution(&perform::eqSortSubs);
                __cxa_atexit(Kernel::RobSubstitution::~RobSubstitution,&perform::eqSortSubs,
                             &__dso_handle);
                __cxa_guard_release(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                     ::eqSortSubs);
              }
              local_180._content = (uint64_t)pp_Var6;
              if (((ulong)pp_Var6 & 1) != 0) {
                Kernel::RobSubstitution::reset(&perform::eqSortSubs);
                bVar11 = Kernel::RobSubstitution::match
                                   (&perform::eqSortSubs,(TermList)local_190[1],0,local_110,1);
                if (!bVar11) goto LAB_004c8ead;
              }
              local_88 = local_1a0;
              local_80 = local_198;
              if (local_198 != (int *)0x0 && local_1a0 != (long *)0x0) {
                *local_198 = *local_198 + 1;
              }
              local_78 = &PTR__SubstApplicator_00b38928;
              local_70 = local_1a0;
              local_68 = &perform::eqSortSubs;
              local_98 = &PTR__SubstApplicator_00b38968;
              local_148 = local_1a0;
              local_90 = local_1a0;
              ctx = (EVP_PKEY_CTX *)&local_78;
              if ((local_180._content & 1) == 0) {
                ctx = (EVP_PKEY_CTX *)&local_98;
              }
              TVar15._content = local_190[2];
              local_1a4 = (TVar15._content & 1) != 0;
              local_108 = local_198;
              if (local_1a4) {
                TVar15._content =
                     (**(code **)(*(long *)ctx + 0x10))(ctx,TVar15._content >> 2 & 0xffffffff);
              }
              local_1a4 = !local_1a4;
              uVar20 = local_190[4];
              if ((this->super_ForwardDemodulation)._useTermOrderingDiagrams == true) {
                Kernel::TermOrderingDiagram::init((TermOrderingDiagram *)local_190[5],ctx);
                if (((char)uVar20 == '\0') &&
                   ((uVar21 = 7, (this->super_ForwardDemodulation)._preorderedOnly != false ||
                    (pvVar16 = Kernel::TermOrderingDiagram::next
                                         ((TermOrderingDiagram *)local_190[5]),
                    pvVar16 == (void *)0x0)))) goto LAB_004c8e68;
LAB_004c8ad2:
                if ((bVar9 != false) && ((this->super_ForwardDemodulation)._encompassing == true)) {
                  RVar13 = Kernel::Ordering::getEqualityArgumentOrder(local_160,(Literal *)term);
                  uVar21 = *(uint *)&term->field_0xc & 0xfffffff;
                  if (((RVar13 == LESS) && (term->_args[uVar21]._content == rwTerm._content)) ||
                     ((RVar13 == GREATER &&
                      (term->_args[(ulong)uVar21 - 1]._content == rwTerm._content)))) {
                    bVar9 = false;
                  }
                }
                if (local_1a4) {
                  TVar15 = Kernel::SubstHelper::applyImpl<false,Kernel::SubstApplicator_const>
                                     (TVar15,(SubstApplicator *)ctx,false);
                }
                if (bVar9 != false) {
                  bVar11 = DemodulationHelper::isPremiseRedundant
                                     (local_150,cl,(Literal *)term,rwTerm,TVar15,local_180,
                                      (SubstApplicator *)ctx);
                  uVar21 = 7;
                  if (!bVar11) goto LAB_004c8e68;
                }
                pLVar17 = Kernel::EqHelper::replace((Literal *)term,rwTerm,TVar15);
                if ((((pLVar17->super_Term)._functor == 0) &&
                    (((pLVar17->super_Term)._args[0]._content & 4) != 0)) &&
                   (uVar20 = (ulong)(*(uint *)&(pLVar17->super_Term).field_0xc & 0xfffffff),
                   (pLVar17->super_Term)._args[uVar20]._content ==
                   (pLVar17->super_Term)._args[uVar20 - 1]._content)) {
                  *(int *)(DAT_00b521c0 + 0x14c) = *(int *)(DAT_00b521c0 + 0x14c) + 1;
                  uVar20 = local_190[3];
                  local_178._0_8_ =
                       Lib::FixedSizeAllocator<32UL>::alloc
                                 ((FixedSizeAllocator<32UL> *)
                                  (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
                  ((IteratorCore<Kernel::Clause_*> *)local_178._0_8_)->_vptr_IteratorCore =
                       (_func_int **)&PTR__IteratorCore_00b37428;
                  *(undefined1 *)
                   &((IteratorCore<Kernel::Clause_*> *)(local_178._0_8_ + 0x10))->_vptr_IteratorCore
                       = 0;
                  *(ulong *)&((IteratorCore<Kernel::Clause_*> *)(local_178._0_8_ + 0x10))->_refCnt =
                       uVar20;
                  ((IteratorCore<Kernel::Clause_*> *)local_178._0_8_)->_refCnt = 1;
                  Lib::VirtualIterator<Kernel::Clause_*>::operator=
                            (local_158,(VirtualIterator<Kernel::Clause_*> *)&local_178);
                  if ((IteratorCore<Kernel::Clause_*> *)local_178._0_8_ !=
                      (IteratorCore<Kernel::Clause_*> *)0x0) {
                    piVar1 = (int *)(local_178._0_8_ + 8);
                    *piVar1 = *piVar1 + -1;
                    if (*piVar1 == 0) {
                      (**(code **)(*(long *)local_178._0_8_ + 8))();
                    }
                  }
                }
                else {
                  Lib::
                  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  ::Recycled(&local_140);
                  SVar8._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                       (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                        )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                          )local_140._self;
                  ppLVar18 = *(Literal ***)
                              ((long)local_140._self._M_t.
                                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                     _M_head_impl + 0x10);
                  if (ppLVar18 ==
                      *(Literal ***)
                       ((long)local_140._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                              _M_head_impl + 0x18)) {
                    Lib::Stack<Kernel::Literal_*>::expand
                              ((Stack<Kernel::Literal_*> *)
                               local_140._self._M_t.
                               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                               _M_head_impl);
                    ppLVar18 = *(Literal ***)
                                ((long)SVar8._M_t.
                                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                       .
                                       super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                       ._M_head_impl + 0x10);
                  }
                  *ppLVar18 = pLVar17;
                  pppLVar2 = (Literal ***)
                             ((long)SVar8._M_t.
                                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                    _M_head_impl + 0x10);
                  *pppLVar2 = *pppLVar2 + 1;
                  uVar20 = 0;
                  do {
                    SVar8._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                         (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                          )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                            )local_140._self;
                    pTVar7 = &cl->_literals[uVar20]->super_Term;
                    if (pTVar7 != term) {
                      ppLVar18 = *(Literal ***)
                                  ((long)local_140._self._M_t.
                                         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                         .
                                         super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                         ._M_head_impl + 0x10);
                      if (ppLVar18 ==
                          *(Literal ***)
                           ((long)local_140._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                  _M_head_impl + 0x18)) {
                        Lib::Stack<Kernel::Literal_*>::expand
                                  ((Stack<Kernel::Literal_*> *)
                                   local_140._self._M_t.
                                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                   _M_head_impl);
                        ppLVar18 = *(Literal ***)
                                    ((long)SVar8._M_t.
                                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                           .
                                           super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                           ._M_head_impl + 0x10);
                      }
                      *ppLVar18 = (Literal *)pTVar7;
                      pppLVar2 = (Literal ***)
                                 ((long)SVar8._M_t.
                                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                        .
                                        super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                        ._M_head_impl + 0x10);
                      *pppLVar2 = *pppLVar2 + 1;
                    }
                    uVar20 = uVar20 + 1;
                  } while (uVar22 != uVar20);
                  *(int *)(DAT_00b521c0 + 0x148) = *(int *)(DAT_00b521c0 + 0x148) + 1;
                  uVar20 = local_190[3];
                  local_178._0_8_ =
                       Lib::FixedSizeAllocator<32UL>::alloc
                                 ((FixedSizeAllocator<32UL> *)
                                  (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
                  ((IteratorCore<Kernel::Clause_*> *)local_178._0_8_)->_vptr_IteratorCore =
                       (_func_int **)&PTR__IteratorCore_00b37428;
                  *(undefined1 *)
                   &((IteratorCore<Kernel::Clause_*> *)(local_178._0_8_ + 0x10))->_vptr_IteratorCore
                       = 0;
                  *(ulong *)&((IteratorCore<Kernel::Clause_*> *)(local_178._0_8_ + 0x10))->_refCnt =
                       uVar20;
                  ((IteratorCore<Kernel::Clause_*> *)local_178._0_8_)->_refCnt = 1;
                  Lib::VirtualIterator<Kernel::Clause_*>::operator=
                            (local_158,(VirtualIterator<Kernel::Clause_*> *)&local_178);
                  if ((IteratorCore<Kernel::Clause_*> *)local_178._0_8_ !=
                      (IteratorCore<Kernel::Clause_*> *)0x0) {
                    piVar1 = (int *)(local_178._0_8_ + 8);
                    *piVar1 = *piVar1 + -1;
                    if (*piVar1 == 0) {
                      (**(code **)(*(long *)local_178._0_8_ + 8))();
                    }
                  }
                  SVar8._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                       (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                        )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                          )local_140._self;
                  local_178.premise2 = (Clause *)local_190[3];
                  local_178.rule = 0x18;
                  local_178.premise1 = cl;
                  Kernel::Inference::Inference(&local_60,&local_178);
                  pCVar19 = Kernel::Clause::fromStack
                                      ((Stack<Kernel::Literal_*> *)
                                       SVar8._M_t.
                                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                       .
                                       super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                       ._M_head_impl,&local_60);
                  *local_118 = pCVar19;
                  if (*(int *)(Lib::env + 0x85a8) == 2) {
                    extra = (InferenceExtra *)::operator_new(0x18);
                    extra->_vptr_InferenceExtra = local_120;
                    extra[1]._vptr_InferenceExtra = (_func_int **)local_180._content;
                    extra[2]._vptr_InferenceExtra = (_func_int **)rwTerm._content;
                    Lib::ProofExtra::insert((ProofExtra *)&DAT_00b521d8,&pCVar19->super_Unit,extra);
                  }
                  Lib::
                  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  ::~Recycled(&local_140);
                }
                uVar21 = 1;
              }
              else {
                if ((char)uVar20 != '\0') goto LAB_004c8ad2;
                uVar21 = 7;
                if ((this->super_ForwardDemodulation)._preorderedOnly == false) {
                  uStack_e0 = uStack_e0 & 0xffffff00;
                  local_d8 = 0;
                  local_100 = TVar15._content;
                  uStack_f8 = local_1a4;
                  local_f0 = ctx;
                  local_e8 = rwTerm._content;
                  iVar14 = (*local_160->_vptr_Ordering[5])();
                  if (iVar14 == 1) goto LAB_004c8ad2;
                }
              }
LAB_004c8e68:
              piVar1 = local_108;
              if ((local_148 != (long *)0x0 && local_108 != (int *)0x0) &&
                 (*local_108 = *local_108 + -1, *local_108 == 0)) {
                (**(code **)(*local_148 + 8))();
                *(undefined8 *)piVar1 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
                Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = piVar1;
              }
            }
LAB_004c8ead:
            if (((local_1a0 != (long *)0x0) && (local_198 != (int *)0x0)) &&
               ((*local_198 = *local_198 + -1, *local_198 == 0 &&
                ((**(code **)(*local_1a0 + 8))(), local_198 != (int *)0x0)))) {
              *(undefined8 *)local_198 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
              Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_198;
            }
          } while (uVar21 == 7);
          if (local_188 != (long *)0x0) {
            plVar3 = local_188 + 1;
            *(int *)plVar3 = (int)*plVar3 + -1;
            if ((int)*plVar3 == 0) {
              (**(code **)(*local_188 + 8))();
            }
          }
        } while ((uVar21 == 5) || (uVar21 == 0));
LAB_004c8f8d:
        local_d0.super_IteratorCore<Kernel::Term_*>._vptr_IteratorCore = local_130;
        if (local_d0._stack._stack != (Term **)0x0) {
          uVar20 = local_d0._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
          if (uVar20 == 0) {
            *local_d0._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_d0._stack._stack;
          }
          else if (uVar20 < 0x11) {
            *local_d0._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_d0._stack._stack;
          }
          else if (uVar20 < 0x19) {
            *local_d0._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_d0._stack._stack;
          }
          else if (uVar20 < 0x21) {
            *local_d0._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_d0._stack._stack;
          }
          else if (uVar20 < 0x31) {
            *local_d0._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_d0._stack._stack;
          }
          else if (uVar20 < 0x41) {
            *local_d0._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_d0._stack._stack;
          }
          else {
            operator_delete(local_d0._stack._stack,0x10);
          }
        }
        uVar20 = local_128;
        if ((uVar21 & 3) != 0) {
          return true;
        }
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar22);
  }
  return false;
}

Assistant:

bool ForwardDemodulationImpl<combinatorySupSupport>::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  TIME_TRACE("forward demodulation");

  Ordering& ordering = _salg->getOrdering();

  //Perhaps it might be a good idea to try to
  //replace subterms in some special order, like
  //the heaviest first...

  static DHSet<TermList> attempted;
  attempted.reset();

  unsigned cLen=cl->length();
  for(unsigned li=0;li<cLen;li++) {
    Literal* lit=(*cl)[li];
    if (lit->isAnswerLiteral()) {
      continue;
    }
    if (_skipNonequationalLiterals && !lit->isEquality()) {
      continue;
    }
    typename std::conditional<!combinatorySupSupport,
      NonVariableNonTypeIterator,
      FirstOrderSubtermIt>::type it(lit);
    while(it.hasNext()) {
      TypedTermList trm = it.next();
      if(!attempted.insert(trm)) {
        //We have already tried to demodulate the term @b trm and did not
        //succeed (otherwise we would have returned from the function).
        //If we have tried the term @b trm, we must have tried to
        //demodulate also its subterms, so we can skip them too.
        it.right();
        continue;
      }

      bool redundancyCheck = _helper.redundancyCheckNeededForPremise(cl, lit, trm);

      auto git = _index->getGeneralizations(trm.term(), /* retrieveSubstitutions */ true);
      while(git.hasNext()) {
        auto qr=git.next();
        ASS_EQ(qr.data->clause->length(),1);

        if(!ColorHelper::compatible(cl->color(), qr.data->clause->color())) {
          continue;
        }

        auto lhs = qr.data->term;

        // TODO:
        // to deal with polymorphic matching
        // Ideally, we would like to extend the substitution
        // returned by the index to carry out the sort match.
        // However, ForwardDemodulation uses a CodeTree as its
        // indexing mechanism, and it is not clear how to extend
        // the substitution returned by a code tree.
        static RobSubstitution eqSortSubs;
        if(lhs.isVar()){
          eqSortSubs.reset();
          TermList querySort = trm.sort();
          TermList eqSort = qr.data->term.sort();
          if(!eqSortSubs.match(eqSort, 0, querySort, 1)){
            continue;
          }
        }

        auto subs = qr.unifier;
        ASS(subs->isIdentityOnQueryWhenResultBound());

        ApplicatorWithEqSort applWithEqSort(subs.ptr(), eqSortSubs);
        Applicator applWithoutEqSort(subs.ptr());
        auto appl = lhs.isVar() ? (SubstApplicator*)&applWithEqSort : (SubstApplicator*)&applWithoutEqSort;

        AppliedTerm rhsApplied(qr.data->rhs,appl,true);
        bool preordered = qr.data->preordered;

        ASS_EQ(ordering.compare(trm,rhsApplied),Ordering::reverse(ordering.compare(rhsApplied,trm)));

        if (_useTermOrderingDiagrams) {
#if VDEBUG
          auto dcomp = ordering.compareUnidirectional(trm,rhsApplied);
#endif
          qr.data->tod->init(appl);
          if (!preordered && (_preorderedOnly || !qr.data->tod->next())) {
            ASS_NEQ(dcomp,Ordering::GREATER);
            continue;
          }
          ASS_EQ(dcomp,Ordering::GREATER);
        } else {
          if (!preordered && (_preorderedOnly || ordering.compareUnidirectional(trm,rhsApplied)!=Ordering::GREATER)) {
            continue;
          }
        }

        // encompassing demodulation is fine when rewriting the smaller guy
        if (redundancyCheck && _encompassing) {
          // this will only run at most once;
          // could have been factored out of the getGeneralizations loop,
          // but then it would run exactly once there
          Ordering::Result litOrder = ordering.getEqualityArgumentOrder(lit);
          if ((trm==*lit->nthArgument(0) && litOrder == Ordering::LESS) ||
              (trm==*lit->nthArgument(1) && litOrder == Ordering::GREATER)) {
            redundancyCheck = false;
          }
        }

        TermList rhsS = rhsApplied.apply();

        if (redundancyCheck && !_helper.isPremiseRedundant(cl, lit, trm, rhsS, lhs, appl)) {
          continue;
        }

        Literal* resLit = EqHelper::replace(lit,trm,rhsS);
        if(EqHelper::isEqTautology(resLit)) {
          env.statistics->forwardDemodulationsToEqTaut++;
          premises = pvi( getSingletonIterator(qr.data->clause));
          return true;
        }

        RStack<Literal*> resLits;
        resLits->push(resLit);

        for(unsigned i=0;i<cLen;i++) {
          Literal* curr=(*cl)[i];
          if(curr!=lit) {
            resLits->push(curr);
          }
        }

        env.statistics->forwardDemodulations++;

        premises = pvi( getSingletonIterator(qr.data->clause));
        replacement = Clause::fromStack(*resLits, SimplifyingInference2(InferenceRule::FORWARD_DEMODULATION, cl, qr.data->clause));
        if(env.options->proofExtra() == Options::ProofExtra::FULL)
          env.proofExtra.insert(replacement, new ForwardDemodulationExtra(lhs, trm));
        return true;
      }
    }
  }

  return false;
}